

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar24;
  long lVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  Geometry *pGVar33;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  long lStack_26d0;
  UVIdentity<4> mapUV;
  undefined1 local_26a8 [16];
  Geometry *local_2698;
  ulong local_2690;
  ulong local_2688;
  long local_2680;
  long local_2678;
  Scene *local_2670;
  RTCFilterFunctionNArguments args;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined1 local_2608 [16];
  undefined1 local_25f8 [16];
  undefined1 local_25e8 [16];
  UVIdentity<4> *local_25d8;
  byte local_25d0;
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  undefined1 local_2588 [16];
  float local_2578 [4];
  undefined1 local_2568 [32];
  undefined1 local_2548 [32];
  undefined1 local_2528 [32];
  undefined1 local_2508 [32];
  undefined1 local_24e8 [32];
  undefined1 local_24c8 [32];
  undefined1 local_24a8 [16];
  undefined8 local_2498;
  undefined8 uStack_2490;
  RTCHitN local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined4 local_2448;
  undefined4 uStack_2444;
  undefined4 uStack_2440;
  undefined4 uStack_243c;
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  uint local_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  uint uStack_2400;
  uint uStack_23fc;
  undefined1 local_23f8 [32];
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  pSVar34 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_24c8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar104 = ZEXT3264(local_24c8);
  local_24e8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar105 = ZEXT3264(local_24e8);
  local_2508 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar106 = ZEXT3264(local_2508);
  fVar79 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2528 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar79 * 0.99999964)));
  auVar107 = ZEXT3264(local_2528);
  local_2548 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar87 * 0.99999964)));
  auVar108 = ZEXT3264(local_2548);
  local_2568 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar94 * 0.99999964)));
  auVar109 = ZEXT3264(local_2568);
  fVar79 = fVar79 * 1.0000004;
  fVar87 = fVar87 * 1.0000004;
  fVar94 = fVar94 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar30 = uVar31 ^ 0x20;
  uVar38 = uVar32 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_23f8._4_4_ = iVar2;
  local_23f8._0_4_ = iVar2;
  local_23f8._8_4_ = iVar2;
  local_23f8._12_4_ = iVar2;
  local_23f8._16_4_ = iVar2;
  local_23f8._20_4_ = iVar2;
  local_23f8._24_4_ = iVar2;
  local_23f8._28_4_ = iVar2;
  auVar101 = ZEXT3264(local_23f8);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar73 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_24a8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar63 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar102 = ZEXT3264(auVar63);
  auVar103 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  local_2398 = fVar79;
  fStack_2394 = fVar79;
  fStack_2390 = fVar79;
  fStack_238c = fVar79;
  fStack_2388 = fVar79;
  fStack_2384 = fVar79;
  fStack_2380 = fVar79;
  fStack_237c = fVar79;
  local_23b8 = fVar87;
  fStack_23b4 = fVar87;
  fStack_23b0 = fVar87;
  fStack_23ac = fVar87;
  fStack_23a8 = fVar87;
  fStack_23a4 = fVar87;
  fStack_23a0 = fVar87;
  fStack_239c = fVar87;
  local_23d8 = fVar94;
  fStack_23d4 = fVar94;
  fStack_23d0 = fVar94;
  fStack_23cc = fVar94;
  fStack_23c8 = fVar94;
  fStack_23c4 = fVar94;
  fStack_23c0 = fVar94;
  fStack_23bc = fVar94;
  fVar81 = fVar79;
  fVar82 = fVar79;
  fVar83 = fVar79;
  fVar84 = fVar79;
  fVar85 = fVar79;
  fVar86 = fVar79;
  fVar88 = fVar87;
  fVar89 = fVar87;
  fVar90 = fVar87;
  fVar91 = fVar87;
  fVar92 = fVar87;
  fVar93 = fVar87;
  fVar95 = fVar94;
  fVar96 = fVar94;
  fVar97 = fVar94;
  fVar98 = fVar94;
  fVar99 = fVar94;
  fVar100 = fVar94;
  local_2690 = uVar32;
  local_2688 = uVar31;
LAB_01d9a1dc:
  do {
    if (pSVar34 == stack) {
      return;
    }
    pSVar24 = pSVar34 + -1;
    pSVar34 = pSVar34 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar24->dist);
  sVar35 = (pSVar34->ptr).ptr;
LAB_01d9a206:
  do {
    if ((sVar35 & 8) != 0) break;
    auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar31),auVar104._0_32_);
    auVar63 = vmulps_avx512vl(auVar107._0_32_,auVar63);
    auVar64 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar32),auVar105._0_32_);
    auVar64 = vmulps_avx512vl(auVar108._0_32_,auVar64);
    auVar63 = vmaxps_avx(auVar63,auVar64);
    auVar64 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar37),auVar106._0_32_);
    auVar64 = vmulps_avx512vl(auVar109._0_32_,auVar64);
    auVar64 = vmaxps_avx(auVar64,auVar101._0_32_);
    auVar63 = vmaxps_avx(auVar63,auVar64);
    auVar65 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar30),auVar104._0_32_);
    auVar64._4_4_ = fVar81 * auVar65._4_4_;
    auVar64._0_4_ = fVar79 * auVar65._0_4_;
    auVar64._8_4_ = fVar82 * auVar65._8_4_;
    auVar64._12_4_ = fVar83 * auVar65._12_4_;
    auVar64._16_4_ = fVar84 * auVar65._16_4_;
    auVar64._20_4_ = fVar85 * auVar65._20_4_;
    auVar64._24_4_ = fVar86 * auVar65._24_4_;
    auVar64._28_4_ = auVar65._28_4_;
    auVar66 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar38),auVar105._0_32_);
    auVar65._4_4_ = fVar88 * auVar66._4_4_;
    auVar65._0_4_ = fVar87 * auVar66._0_4_;
    auVar65._8_4_ = fVar89 * auVar66._8_4_;
    auVar65._12_4_ = fVar90 * auVar66._12_4_;
    auVar65._16_4_ = fVar91 * auVar66._16_4_;
    auVar65._20_4_ = fVar92 * auVar66._20_4_;
    auVar65._24_4_ = fVar93 * auVar66._24_4_;
    auVar65._28_4_ = auVar66._28_4_;
    auVar64 = vminps_avx(auVar64,auVar65);
    auVar65 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar37 ^ 0x20)),
                              auVar106._0_32_);
    auVar66._4_4_ = fVar95 * auVar65._4_4_;
    auVar66._0_4_ = fVar94 * auVar65._0_4_;
    auVar66._8_4_ = fVar96 * auVar65._8_4_;
    auVar66._12_4_ = fVar97 * auVar65._12_4_;
    auVar66._16_4_ = fVar98 * auVar65._16_4_;
    auVar66._20_4_ = fVar99 * auVar65._20_4_;
    auVar66._24_4_ = fVar100 * auVar65._24_4_;
    auVar66._28_4_ = auVar65._28_4_;
    auVar65 = vminps_avx(auVar66,auVar73._0_32_);
    auVar64 = vminps_avx(auVar64,auVar65);
    uVar36 = vcmpps_avx512vl(auVar63,auVar64,2);
    bVar27 = (byte)uVar36;
    if (bVar27 == 0) goto LAB_01d9a1dc;
    auVar64 = *(undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0);
    auVar65 = ((undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0))[1];
    auVar66 = vpternlogd_avx512vl(auVar102._0_32_,auVar63,auVar103._0_32_,0xf8);
    auVar67 = vpcompressd_avx512vl(auVar66);
    auVar68._0_4_ = (uint)(bVar27 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar66._0_4_;
    bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
    auVar68._4_4_ = (uint)bVar39 * auVar67._4_4_ | (uint)!bVar39 * auVar66._4_4_;
    bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
    auVar68._8_4_ = (uint)bVar39 * auVar67._8_4_ | (uint)!bVar39 * auVar66._8_4_;
    bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
    auVar68._12_4_ = (uint)bVar39 * auVar67._12_4_ | (uint)!bVar39 * auVar66._12_4_;
    bVar39 = (bool)((byte)(uVar36 >> 4) & 1);
    auVar68._16_4_ = (uint)bVar39 * auVar67._16_4_ | (uint)!bVar39 * auVar66._16_4_;
    bVar39 = (bool)((byte)(uVar36 >> 5) & 1);
    auVar68._20_4_ = (uint)bVar39 * auVar67._20_4_ | (uint)!bVar39 * auVar66._20_4_;
    bVar39 = (bool)((byte)(uVar36 >> 6) & 1);
    auVar68._24_4_ = (uint)bVar39 * auVar67._24_4_ | (uint)!bVar39 * auVar66._24_4_;
    bVar39 = SUB81(uVar36 >> 7,0);
    auVar68._28_4_ = (uint)bVar39 * auVar67._28_4_ | (uint)!bVar39 * auVar66._28_4_;
    auVar66 = vpermt2q_avx512vl(auVar64,auVar68,auVar65);
    sVar35 = auVar66._0_8_;
    bVar27 = bVar27 - 1 & bVar27;
    if (bVar27 != 0) {
      auVar66 = vpshufd_avx2(auVar68,0x55);
      vpermt2q_avx512vl(auVar64,auVar66,auVar65);
      auVar67 = vpminsd_avx2(auVar68,auVar66);
      auVar66 = vpmaxsd_avx2(auVar68,auVar66);
      bVar27 = bVar27 - 1 & bVar27;
      if (bVar27 == 0) {
        auVar68 = vpermi2q_avx512vl(auVar67,auVar64,auVar65);
        sVar35 = auVar68._0_8_;
        auVar64 = vpermt2q_avx512vl(auVar64,auVar66,auVar65);
        (pSVar34->ptr).ptr = auVar64._0_8_;
        lVar25 = 8;
        lStack_26d0 = 0x10;
      }
      else {
        auVar16 = vpshufd_avx2(auVar68,0xaa);
        vpermt2q_avx512vl(auVar64,auVar16,auVar65);
        auVar70 = vpminsd_avx2(auVar67,auVar16);
        auVar67 = vpmaxsd_avx2(auVar67,auVar16);
        auVar16 = vpminsd_avx2(auVar66,auVar67);
        auVar67 = vpmaxsd_avx2(auVar66,auVar67);
        bVar27 = bVar27 - 1 & bVar27;
        if (bVar27 == 0) {
          auVar66 = vpermi2q_avx512vl(auVar70,auVar64,auVar65);
          sVar35 = auVar66._0_8_;
          auVar66 = vpermt2q_avx512vl(auVar64,auVar67,auVar65);
          (pSVar34->ptr).ptr = auVar66._0_8_;
          auVar66 = vpermd_avx2(auVar67,auVar63);
          pSVar34->dist = auVar66._0_4_;
          auVar64 = vpermt2q_avx512vl(auVar64,auVar16,auVar65);
          pSVar34[1].ptr.ptr = auVar64._0_8_;
          lStack_26d0 = 0x18;
          lVar25 = lStack_26d0;
          lStack_26d0 = 0x20;
          auVar66 = auVar16;
        }
        else {
          auVar66 = vpshufd_avx2(auVar68,0xff);
          vpermt2q_avx512vl(auVar64,auVar66,auVar65);
          auVar15 = vpminsd_avx2(auVar70,auVar66);
          auVar70 = vpmaxsd_avx2(auVar70,auVar66);
          auVar66 = vpminsd_avx2(auVar16,auVar70);
          auVar70 = vpmaxsd_avx2(auVar16,auVar70);
          auVar16 = vpminsd_avx2(auVar67,auVar70);
          auVar67 = vpmaxsd_avx2(auVar67,auVar70);
          bVar27 = bVar27 - 1 & bVar27;
          if (bVar27 != 0) {
            auVar69 = valignd_avx512vl(auVar68,auVar68,3);
            auVar68 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar70 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar68,auVar15);
            auVar68 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar66 = vpermt2d_avx512vl(auVar70,auVar68,auVar66);
            auVar68 = vpermt2d_avx512vl(auVar66,auVar68,auVar16);
            auVar66 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar66 = vpermt2d_avx512vl(auVar68,auVar66,auVar67);
            auVar104 = ZEXT3264(auVar66);
            bVar26 = bVar27;
            do {
              auVar68 = auVar104._0_32_;
              auVar67._8_4_ = 1;
              auVar67._0_8_ = 0x100000001;
              auVar67._12_4_ = 1;
              auVar67._16_4_ = 1;
              auVar67._20_4_ = 1;
              auVar67._24_4_ = 1;
              auVar67._28_4_ = 1;
              auVar66 = vpermd_avx2(auVar67,auVar69);
              auVar69 = valignd_avx512vl(auVar69,auVar69,1);
              vpermt2q_avx512vl(auVar64,auVar69,auVar65);
              bVar26 = bVar26 - 1 & bVar26;
              uVar19 = vpcmpd_avx512vl(auVar66,auVar68,5);
              auVar66 = vpmaxsd_avx2(auVar66,auVar68);
              bVar20 = (byte)uVar19 << 1;
              auVar68 = valignd_avx512vl(auVar68,auVar68,7);
              bVar39 = (bool)((byte)uVar19 & 1);
              bVar10 = (bool)(bVar20 >> 2 & 1);
              bVar11 = (bool)(bVar20 >> 3 & 1);
              bVar12 = (bool)(bVar20 >> 4 & 1);
              bVar13 = (bool)(bVar20 >> 5 & 1);
              bVar14 = (bool)(bVar20 >> 6 & 1);
              auVar104 = ZEXT3264(CONCAT428((uint)(bVar20 >> 7) * auVar68._28_4_ |
                                            (uint)!(bool)(bVar20 >> 7) * auVar66._28_4_,
                                            CONCAT424((uint)bVar14 * auVar68._24_4_ |
                                                      (uint)!bVar14 * auVar66._24_4_,
                                                      CONCAT420((uint)bVar13 * auVar68._20_4_ |
                                                                (uint)!bVar13 * auVar66._20_4_,
                                                                CONCAT416((uint)bVar12 *
                                                                          auVar68._16_4_ |
                                                                          (uint)!bVar12 *
                                                                          auVar66._16_4_,
                                                                          CONCAT412((uint)bVar11 *
                                                                                    auVar68._12_4_ |
                                                                                    (uint)!bVar11 *
                                                                                    auVar66._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar10 * auVar68._8_4_ |
                                                  (uint)!bVar10 * auVar66._8_4_,
                                                  CONCAT44((uint)bVar39 * auVar68._4_4_ |
                                                           (uint)!bVar39 * auVar66._4_4_,
                                                           auVar66._0_4_))))))));
            } while (bVar26 != 0);
            lVar25 = (ulong)(uint)POPCOUNT((uint)bVar27) + 3;
            while( true ) {
              auVar68 = auVar104._0_32_;
              auVar66 = vpermt2q_avx512vl(auVar64,auVar68,auVar65);
              sVar35 = auVar66._0_8_;
              bVar39 = lVar25 == 0;
              lVar25 = lVar25 + -1;
              if (bVar39) break;
              (pSVar34->ptr).ptr = sVar35;
              auVar66 = vpermd_avx2(auVar68,auVar63);
              pSVar34->dist = auVar66._0_4_;
              auVar66 = valignd_avx512vl(auVar68,auVar68,1);
              auVar104 = ZEXT3264(auVar66);
              pSVar34 = pSVar34 + 1;
            }
            auVar104 = ZEXT3264(local_24c8);
            auVar105 = ZEXT3264(local_24e8);
            auVar106 = ZEXT3264(local_2508);
            auVar107 = ZEXT3264(local_2528);
            auVar108 = ZEXT3264(local_2548);
            auVar109 = ZEXT3264(local_2568);
            goto LAB_01d9a206;
          }
          auVar68 = vpermi2q_avx512vl(auVar15,auVar64,auVar65);
          sVar35 = auVar68._0_8_;
          auVar68 = vpermt2q_avx512vl(auVar64,auVar67,auVar65);
          (pSVar34->ptr).ptr = auVar68._0_8_;
          auVar68 = vpermd_avx2(auVar67,auVar63);
          pSVar34->dist = auVar68._0_4_;
          auVar68 = vpermt2q_avx512vl(auVar64,auVar16,auVar65);
          pSVar34[1].ptr.ptr = auVar68._0_8_;
          auVar68 = vpermd_avx2(auVar16,auVar63);
          pSVar34[1].dist = auVar68._0_4_;
          auVar64 = vpermt2q_avx512vl(auVar64,auVar66,auVar65);
          pSVar34[2].ptr.ptr = auVar64._0_8_;
          lVar25 = 0x28;
          lStack_26d0 = 0x30;
        }
      }
      auVar63 = vpermd_avx2(auVar66,auVar63);
      *(int *)((long)&(pSVar34->ptr).ptr + lVar25) = auVar63._0_4_;
      pSVar34 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar34->ptr).ptr + lStack_26d0);
    }
  } while( true );
  local_2680 = (ulong)((uint)sVar35 & 0xf) - 8;
  uVar36 = sVar35 & 0xfffffffffffffff0;
  for (local_2678 = 0; local_2678 != local_2680; local_2678 = local_2678 + 1) {
    lVar25 = local_2678 * 0x50;
    local_2670 = context->scene;
    ppfVar4 = (local_2670->vertices).items;
    pfVar5 = ppfVar4[*(uint *)(uVar36 + 0x30 + lVar25)];
    pfVar6 = ppfVar4[*(uint *)(uVar36 + 0x34 + lVar25)];
    pfVar7 = ppfVar4[*(uint *)(uVar36 + 0x38 + lVar25)];
    pfVar8 = ppfVar4[*(uint *)(uVar36 + 0x3c + lVar25)];
    auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + lVar25)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 8 + lVar25)));
    auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + lVar25)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 8 + lVar25)));
    auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 4 + lVar25)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0xc + lVar25)));
    auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 4 + lVar25)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0xc + lVar25)));
    auVar57 = vunpcklps_avx(auVar60,auVar61);
    auVar58 = vunpcklps_avx(auVar59,auVar56);
    auVar61 = vunpckhps_avx(auVar59,auVar56);
    auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x10 + lVar25)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x18 + lVar25)));
    auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x10 + lVar25)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x18 + lVar25)));
    auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x14 + lVar25)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x1c + lVar25)));
    auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x14 + lVar25)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x1c + lVar25)));
    auVar43 = vunpcklps_avx(auVar60,auVar59);
    auVar41 = vunpcklps_avx(auVar56,auVar40);
    auVar56 = vunpckhps_avx(auVar56,auVar40);
    auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x20 + lVar25)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x28 + lVar25)));
    auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x20 + lVar25)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x28 + lVar25)));
    auVar42 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x24 + lVar25)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x2c + lVar25)));
    auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x24 + lVar25)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x2c + lVar25)));
    auVar46 = vunpcklps_avx(auVar60,auVar59);
    auVar44 = vunpcklps_avx(auVar40,auVar42);
    puVar1 = (undefined8 *)(uVar36 + 0x30 + lVar25);
    local_2498 = *puVar1;
    uStack_2490 = puVar1[1];
    puVar1 = (undefined8 *)(uVar36 + 0x40 + lVar25);
    local_2618 = *puVar1;
    uStack_2610 = puVar1[1];
    uVar78 = *(undefined4 *)(ray + k * 4);
    auVar45._4_4_ = uVar78;
    auVar45._0_4_ = uVar78;
    auVar45._8_4_ = uVar78;
    auVar45._12_4_ = uVar78;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar47._4_4_ = uVar78;
    auVar47._0_4_ = uVar78;
    auVar47._8_4_ = uVar78;
    auVar47._12_4_ = uVar78;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar48._4_4_ = uVar78;
    auVar48._0_4_ = uVar78;
    auVar48._8_4_ = uVar78;
    auVar48._12_4_ = uVar78;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar75._4_4_ = uVar78;
    auVar75._0_4_ = uVar78;
    auVar75._8_4_ = uVar78;
    auVar75._12_4_ = uVar78;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar77._4_4_ = uVar78;
    auVar77._0_4_ = uVar78;
    auVar77._8_4_ = uVar78;
    auVar77._12_4_ = uVar78;
    auVar40 = vunpckhps_avx512vl(auVar40,auVar42);
    fVar79 = *(float *)(ray + k * 4 + 0x60);
    auVar80._4_4_ = fVar79;
    auVar80._0_4_ = fVar79;
    auVar80._8_4_ = fVar79;
    auVar80._12_4_ = fVar79;
    auVar60 = vsubps_avx(auVar58,auVar45);
    auVar61 = vsubps_avx(auVar61,auVar47);
    auVar59 = vsubps_avx(auVar57,auVar48);
    auVar41 = vsubps_avx512vl(auVar41,auVar45);
    auVar42 = vsubps_avx512vl(auVar56,auVar47);
    auVar43 = vsubps_avx512vl(auVar43,auVar48);
    auVar44 = vsubps_avx512vl(auVar44,auVar45);
    auVar45 = vsubps_avx512vl(auVar40,auVar47);
    auVar56 = vsubps_avx(auVar46,auVar48);
    auVar46 = vsubps_avx512vl(auVar44,auVar60);
    auVar57 = vsubps_avx(auVar45,auVar61);
    auVar58 = vsubps_avx(auVar56,auVar59);
    auVar47 = vsubps_avx512vl(auVar60,auVar41);
    auVar48 = vsubps_avx512vl(auVar61,auVar42);
    auVar49 = vsubps_avx512vl(auVar59,auVar43);
    auVar50 = vsubps_avx512vl(auVar41,auVar44);
    auVar51 = vsubps_avx512vl(auVar42,auVar45);
    auVar52 = vsubps_avx512vl(auVar43,auVar56);
    auVar40 = vaddps_avx512vl(auVar44,auVar60);
    auVar76._0_4_ = auVar45._0_4_ + auVar61._0_4_;
    auVar76._4_4_ = auVar45._4_4_ + auVar61._4_4_;
    auVar76._8_4_ = auVar45._8_4_ + auVar61._8_4_;
    auVar76._12_4_ = auVar45._12_4_ + auVar61._12_4_;
    auVar53 = vaddps_avx512vl(auVar56,auVar59);
    auVar54 = vmulps_avx512vl(auVar76,auVar58);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar57,auVar53);
    auVar53 = vmulps_avx512vl(auVar53,auVar46);
    auVar53 = vfmsub231ps_avx512vl(auVar53,auVar58,auVar40);
    auVar55._0_4_ = auVar57._0_4_ * auVar40._0_4_;
    auVar55._4_4_ = auVar57._4_4_ * auVar40._4_4_;
    auVar55._8_4_ = auVar57._8_4_ * auVar40._8_4_;
    auVar55._12_4_ = auVar57._12_4_ * auVar40._12_4_;
    auVar40 = vfmsub231ps_fma(auVar55,auVar46,auVar76);
    auVar74._0_4_ = fVar79 * auVar40._0_4_;
    auVar74._4_4_ = fVar79 * auVar40._4_4_;
    auVar74._8_4_ = fVar79 * auVar40._8_4_;
    auVar74._12_4_ = fVar79 * auVar40._12_4_;
    auVar40 = vfmadd231ps_avx512vl(auVar74,auVar77,auVar53);
    local_2608 = vfmadd231ps_avx512vl(auVar40,auVar75,auVar54);
    auVar40 = vaddps_avx512vl(auVar60,auVar41);
    auVar53 = vaddps_avx512vl(auVar61,auVar42);
    auVar54 = vaddps_avx512vl(auVar59,auVar43);
    auVar55 = vmulps_avx512vl(auVar53,auVar49);
    auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar54);
    auVar54 = vmulps_avx512vl(auVar54,auVar47);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar49,auVar40);
    auVar40 = vmulps_avx512vl(auVar40,auVar48);
    auVar40 = vfmsub231ps_avx512vl(auVar40,auVar47,auVar53);
    auVar53._0_4_ = fVar79 * auVar40._0_4_;
    auVar53._4_4_ = fVar79 * auVar40._4_4_;
    auVar53._8_4_ = fVar79 * auVar40._8_4_;
    auVar53._12_4_ = fVar79 * auVar40._12_4_;
    auVar40 = vfmadd231ps_avx512vl(auVar53,auVar77,auVar54);
    local_25f8 = vfmadd231ps_avx512vl(auVar40,auVar75,auVar55);
    auVar40 = vaddps_avx512vl(auVar41,auVar44);
    auVar41 = vaddps_avx512vl(auVar42,auVar45);
    auVar56 = vaddps_avx512vl(auVar43,auVar56);
    auVar43 = vmulps_avx512vl(auVar41,auVar52);
    auVar43 = vfmsub231ps_avx512vl(auVar43,auVar51,auVar56);
    auVar42._0_4_ = auVar56._0_4_ * auVar50._0_4_;
    auVar42._4_4_ = auVar56._4_4_ * auVar50._4_4_;
    auVar42._8_4_ = auVar56._8_4_ * auVar50._8_4_;
    auVar42._12_4_ = auVar56._12_4_ * auVar50._12_4_;
    auVar56 = vfmsub231ps_avx512vl(auVar42,auVar52,auVar40);
    auVar40 = vmulps_avx512vl(auVar40,auVar51);
    auVar40 = vfmsub231ps_avx512vl(auVar40,auVar50,auVar41);
    auVar40 = vmulps_avx512vl(auVar40,auVar80);
    auVar56 = vfmadd231ps_avx512vl(auVar40,auVar77,auVar56);
    auVar43 = vfmadd231ps_avx512vl(auVar56,auVar75,auVar43);
    auVar41._0_4_ = local_2608._0_4_ + local_25f8._0_4_;
    auVar41._4_4_ = local_2608._4_4_ + local_25f8._4_4_;
    auVar41._8_4_ = local_2608._8_4_ + local_25f8._8_4_;
    auVar41._12_4_ = local_2608._12_4_ + local_25f8._12_4_;
    local_25e8 = vaddps_avx512vl(auVar43,auVar41);
    auVar56._8_4_ = 0x7fffffff;
    auVar56._0_8_ = 0x7fffffff7fffffff;
    auVar56._12_4_ = 0x7fffffff;
    auVar56 = vandps_avx512vl(local_25e8,auVar56);
    auVar40._8_4_ = 0x34000000;
    auVar40._0_8_ = 0x3400000034000000;
    auVar40._12_4_ = 0x34000000;
    auVar40 = vmulps_avx512vl(auVar56,auVar40);
    auVar41 = vminps_avx512vl(local_2608,local_25f8);
    auVar41 = vminps_avx512vl(auVar41,auVar43);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar42 = vxorps_avx512vl(auVar40,auVar42);
    uVar19 = vcmpps_avx512vl(auVar41,auVar42,5);
    auVar41 = vmaxps_avx512vl(local_2608,local_25f8);
    auVar43 = vmaxps_avx512vl(auVar41,auVar43);
    uVar17 = vcmpps_avx512vl(auVar43,auVar40,2);
    bVar27 = ((byte)uVar19 | (byte)uVar17) & 0xf;
    if (bVar27 != 0) {
      auVar40 = vmulps_avx512vl(auVar48,auVar58);
      auVar43 = vmulps_avx512vl(auVar46,auVar49);
      auVar41 = vmulps_avx512vl(auVar47,auVar57);
      auVar42 = vmulps_avx512vl(auVar51,auVar49);
      auVar44 = vmulps_avx512vl(auVar47,auVar52);
      auVar45 = vmulps_avx512vl(auVar50,auVar48);
      auVar57 = vfmsub213ps_avx512vl(auVar57,auVar49,auVar40);
      auVar58 = vfmsub213ps_avx512vl(auVar58,auVar47,auVar43);
      auVar46 = vfmsub213ps_avx512vl(auVar46,auVar48,auVar41);
      auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar42);
      auVar49 = vfmsub213ps_avx512vl(auVar50,auVar49,auVar44);
      auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar45);
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar40 = vandps_avx512vl(auVar40,auVar50);
      auVar42 = vandps_avx512vl(auVar42,auVar50);
      uVar31 = vcmpps_avx512vl(auVar40,auVar42,1);
      auVar40 = vandps_avx512vl(auVar43,auVar50);
      auVar43 = vandps_avx512vl(auVar44,auVar50);
      uVar32 = vcmpps_avx512vl(auVar40,auVar43,1);
      auVar40 = vandps_avx512vl(auVar41,auVar50);
      auVar43 = vandps_avx512vl(auVar45,auVar50);
      uVar18 = vcmpps_avx512vl(auVar40,auVar43,1);
      bVar39 = (bool)((byte)uVar31 & 1);
      local_2598._0_4_ = (uint)bVar39 * auVar57._0_4_ | (uint)!bVar39 * auVar48._0_4_;
      bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
      local_2598._4_4_ = (uint)bVar39 * auVar57._4_4_ | (uint)!bVar39 * auVar48._4_4_;
      bVar39 = (bool)((byte)(uVar31 >> 2) & 1);
      local_2598._8_4_ = (uint)bVar39 * auVar57._8_4_ | (uint)!bVar39 * auVar48._8_4_;
      bVar39 = (bool)((byte)(uVar31 >> 3) & 1);
      local_2598._12_4_ = (uint)bVar39 * auVar57._12_4_ | (uint)!bVar39 * auVar48._12_4_;
      bVar39 = (bool)((byte)uVar32 & 1);
      local_2588._0_4_ = (uint)bVar39 * auVar58._0_4_ | (uint)!bVar39 * auVar49._0_4_;
      bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
      local_2588._4_4_ = (uint)bVar39 * auVar58._4_4_ | (uint)!bVar39 * auVar49._4_4_;
      bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
      local_2588._8_4_ = (uint)bVar39 * auVar58._8_4_ | (uint)!bVar39 * auVar49._8_4_;
      bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
      local_2588._12_4_ = (uint)bVar39 * auVar58._12_4_ | (uint)!bVar39 * auVar49._12_4_;
      bVar39 = (bool)((byte)uVar18 & 1);
      local_2578[0] = (float)((uint)bVar39 * auVar46._0_4_ | (uint)!bVar39 * auVar47._0_4_);
      bVar39 = (bool)((byte)(uVar18 >> 1) & 1);
      local_2578[1] = (float)((uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * auVar47._4_4_);
      bVar39 = (bool)((byte)(uVar18 >> 2) & 1);
      local_2578[2] = (float)((uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * auVar47._8_4_);
      bVar39 = (bool)((byte)(uVar18 >> 3) & 1);
      local_2578[3] = (float)((uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * auVar47._12_4_);
      auVar43._0_4_ = fVar79 * local_2578[0];
      auVar43._4_4_ = fVar79 * local_2578[1];
      auVar43._8_4_ = fVar79 * local_2578[2];
      auVar43._12_4_ = fVar79 * local_2578[3];
      auVar57 = vfmadd213ps_fma(auVar77,local_2588,auVar43);
      auVar57 = vfmadd213ps_fma(auVar75,local_2598,auVar57);
      auVar58._0_4_ = auVar57._0_4_ + auVar57._0_4_;
      auVar58._4_4_ = auVar57._4_4_ + auVar57._4_4_;
      auVar58._8_4_ = auVar57._8_4_ + auVar57._8_4_;
      auVar58._12_4_ = auVar57._12_4_ + auVar57._12_4_;
      auVar57._0_4_ = auVar59._0_4_ * local_2578[0];
      auVar57._4_4_ = auVar59._4_4_ * local_2578[1];
      auVar57._8_4_ = auVar59._8_4_ * local_2578[2];
      auVar57._12_4_ = auVar59._12_4_ * local_2578[3];
      auVar61 = vfmadd213ps_fma(auVar61,local_2588,auVar57);
      auVar61 = vfmadd213ps_fma(auVar60,local_2598,auVar61);
      auVar59 = vrcp14ps_avx512vl(auVar58);
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60 = vfnmadd213ps_avx512vl(auVar59,auVar58,auVar60);
      auVar60 = vfmadd132ps_fma(auVar60,auVar59,auVar59);
      uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar59._4_4_ = uVar78;
      auVar59._0_4_ = uVar78;
      auVar59._8_4_ = uVar78;
      auVar59._12_4_ = uVar78;
      auVar101 = ZEXT1664(auVar59);
      local_25a8._0_4_ = auVar60._0_4_ * (auVar61._0_4_ + auVar61._0_4_);
      local_25a8._4_4_ = auVar60._4_4_ * (auVar61._4_4_ + auVar61._4_4_);
      local_25a8._8_4_ = auVar60._8_4_ * (auVar61._8_4_ + auVar61._8_4_);
      local_25a8._12_4_ = auVar60._12_4_ * (auVar61._12_4_ + auVar61._12_4_);
      auVar73 = ZEXT1664(local_25a8);
      uVar19 = vcmpps_avx512vl(local_25a8,auVar59,2);
      uVar78 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar61._4_4_ = uVar78;
      auVar61._0_4_ = uVar78;
      auVar61._8_4_ = uVar78;
      auVar61._12_4_ = uVar78;
      uVar17 = vcmpps_avx512vl(local_25a8,auVar61,0xd);
      bVar27 = (byte)uVar19 & (byte)uVar17 & bVar27;
      if (bVar27 != 0) {
        uVar19 = vcmpps_avx512vl(auVar58,_DAT_01f45a50,4);
        bVar27 = bVar27 & (byte)uVar19;
        if (bVar27 != 0) {
          local_25d8 = &mapUV;
          local_25d0 = bVar27;
          auVar46._8_4_ = 0x219392ef;
          auVar46._0_8_ = 0x219392ef219392ef;
          auVar46._12_4_ = 0x219392ef;
          uVar31 = vcmpps_avx512vl(auVar56,auVar46,5);
          auVar61 = vrcp14ps_avx512vl(local_25e8);
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          auVar60 = vfnmadd213ps_fma(local_25e8,auVar61,auVar52);
          auVar60 = vfmadd132ps_avx512vl(auVar60,auVar61,auVar61);
          fVar79 = (float)((uint)((byte)uVar31 & 1) * auVar60._0_4_);
          fVar81 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar60._4_4_);
          fVar94 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar60._8_4_);
          fVar87 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar60._12_4_);
          auVar49._0_4_ = fVar79 * local_2608._0_4_;
          auVar49._4_4_ = fVar81 * local_2608._4_4_;
          auVar49._8_4_ = fVar94 * local_2608._8_4_;
          auVar49._12_4_ = fVar87 * local_2608._12_4_;
          local_25c8 = vminps_avx(auVar49,auVar52);
          auVar50._0_4_ = fVar79 * local_25f8._0_4_;
          auVar50._4_4_ = fVar81 * local_25f8._4_4_;
          auVar50._8_4_ = fVar94 * local_25f8._8_4_;
          auVar50._12_4_ = fVar87 * local_25f8._12_4_;
          local_25b8 = vminps_avx(auVar50,auVar52);
          auVar51._8_4_ = 0x7f800000;
          auVar51._0_8_ = 0x7f8000007f800000;
          auVar51._12_4_ = 0x7f800000;
          auVar60 = vblendmps_avx512vl(auVar51,local_25a8);
          auVar44._0_4_ =
               (uint)(bVar27 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar27 & 1) * 0x7f800000;
          bVar39 = (bool)(bVar27 >> 1 & 1);
          auVar44._4_4_ = (uint)bVar39 * auVar60._4_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)(bVar27 >> 2 & 1);
          auVar44._8_4_ = (uint)bVar39 * auVar60._8_4_ | (uint)!bVar39 * 0x7f800000;
          auVar44._12_4_ =
               (uint)(bVar27 >> 3) * auVar60._12_4_ | (uint)!(bool)(bVar27 >> 3) * 0x7f800000;
          auVar60 = vshufps_avx(auVar44,auVar44,0xb1);
          auVar60 = vminps_avx(auVar60,auVar44);
          auVar61 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vminps_avx(auVar61,auVar60);
          uVar19 = vcmpps_avx512vl(auVar44,auVar60,0);
          bVar26 = (byte)uVar19 & bVar27;
          do {
            bVar20 = bVar27;
            if (bVar26 != 0) {
              bVar20 = bVar26;
            }
            uVar21 = 0;
            for (uVar28 = (uint)bVar20; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
              uVar21 = uVar21 + 1;
            }
            uVar29 = uVar21 & 0xff;
            uVar28 = *(uint *)((long)&local_2498 + (ulong)uVar29 * 4);
            pGVar33 = (local_2670->geometries).items[uVar28].ptr;
            if ((pGVar33->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar27 = ~(byte)(1 << (uVar21 & 0x1f)) & bVar27;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar33->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar31 = (ulong)(uVar29 << 2);
                uVar78 = *(undefined4 *)(local_25c8 + uVar31);
                uVar3 = *(undefined4 *)(local_25b8 + uVar31);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a8 + uVar31);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2598 + uVar31);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2588 + uVar31);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_2578 + uVar31);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar78;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2618 + uVar31);
                *(uint *)(ray + k * 4 + 0x120) = uVar28;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              uVar31 = (ulong)(uVar29 * 4);
              uVar78 = *(undefined4 *)(local_25c8 + uVar31);
              local_2458._4_4_ = uVar78;
              local_2458._0_4_ = uVar78;
              local_2458._8_4_ = uVar78;
              local_2458._12_4_ = uVar78;
              local_2448 = *(undefined4 *)(local_25b8 + uVar31);
              local_2428 = vpbroadcastd_avx512vl();
              uVar78 = *(undefined4 *)((long)&local_2618 + uVar31);
              local_2438._4_4_ = uVar78;
              local_2438._0_4_ = uVar78;
              local_2438._8_4_ = uVar78;
              local_2438._12_4_ = uVar78;
              uVar78 = *(undefined4 *)(local_2598 + uVar31);
              uVar3 = *(undefined4 *)(local_2588 + uVar31);
              local_2478._4_4_ = uVar3;
              local_2478._0_4_ = uVar3;
              local_2478._8_4_ = uVar3;
              local_2478._12_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)local_2578 + uVar31);
              local_2468._4_4_ = uVar3;
              local_2468._0_4_ = uVar3;
              local_2468._8_4_ = uVar3;
              local_2468._12_4_ = uVar3;
              local_2488[0] = (RTCHitN)(char)uVar78;
              local_2488[1] = (RTCHitN)(char)((uint)uVar78 >> 8);
              local_2488[2] = (RTCHitN)(char)((uint)uVar78 >> 0x10);
              local_2488[3] = (RTCHitN)(char)((uint)uVar78 >> 0x18);
              local_2488[4] = (RTCHitN)(char)uVar78;
              local_2488[5] = (RTCHitN)(char)((uint)uVar78 >> 8);
              local_2488[6] = (RTCHitN)(char)((uint)uVar78 >> 0x10);
              local_2488[7] = (RTCHitN)(char)((uint)uVar78 >> 0x18);
              local_2488[8] = (RTCHitN)(char)uVar78;
              local_2488[9] = (RTCHitN)(char)((uint)uVar78 >> 8);
              local_2488[10] = (RTCHitN)(char)((uint)uVar78 >> 0x10);
              local_2488[0xb] = (RTCHitN)(char)((uint)uVar78 >> 0x18);
              local_2488[0xc] = (RTCHitN)(char)uVar78;
              local_2488[0xd] = (RTCHitN)(char)((uint)uVar78 >> 8);
              local_2488[0xe] = (RTCHitN)(char)((uint)uVar78 >> 0x10);
              local_2488[0xf] = (RTCHitN)(char)((uint)uVar78 >> 0x18);
              uStack_2444 = local_2448;
              uStack_2440 = local_2448;
              uStack_243c = local_2448;
              vpcmpeqd_avx2(ZEXT1632(local_2458),ZEXT1632(local_2458));
              uStack_2414 = context->user->instID[0];
              local_2418 = uStack_2414;
              uStack_2410 = uStack_2414;
              uStack_240c = uStack_2414;
              uStack_2408 = context->user->instPrimID[0];
              uStack_2404 = uStack_2408;
              uStack_2400 = uStack_2408;
              uStack_23fc = uStack_2408;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a8 + uVar31);
              local_26a8 = local_24a8;
              args.valid = (int *)local_26a8;
              args.geometryUserPtr = pGVar33->userPtr;
              args.context = context->user;
              args.hit = local_2488;
              args.N = 4;
              auVar60 = auVar73._0_16_;
              auVar61 = auVar101._0_16_;
              args.ray = (RTCRayN *)ray;
              if (pGVar33->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_2698 = pGVar33;
                (*pGVar33->intersectionFilterN)(&args);
                auVar101 = ZEXT1664(auVar61);
                auVar73 = ZEXT1664(auVar60);
                auVar109 = ZEXT3264(local_2568);
                auVar108 = ZEXT3264(local_2548);
                auVar107 = ZEXT3264(local_2528);
                auVar106 = ZEXT3264(local_2508);
                auVar105 = ZEXT3264(local_24e8);
                auVar104 = ZEXT3264(local_24c8);
                pGVar33 = local_2698;
              }
              uVar31 = vptestmd_avx512vl(local_26a8,local_26a8);
              if ((uVar31 & 0xf) == 0) {
LAB_01d9ae4a:
                *(int *)(ray + k * 4 + 0x80) = auVar101._0_4_;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar33->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var9)(&args);
                  auVar101 = ZEXT1664(auVar61);
                  auVar73 = ZEXT1664(auVar60);
                  auVar109 = ZEXT3264(local_2568);
                  auVar108 = ZEXT3264(local_2548);
                  auVar107 = ZEXT3264(local_2528);
                  auVar106 = ZEXT3264(local_2508);
                  auVar105 = ZEXT3264(local_24e8);
                  auVar104 = ZEXT3264(local_24c8);
                }
                uVar31 = vptestmd_avx512vl(local_26a8,local_26a8);
                uVar31 = uVar31 & 0xf;
                bVar26 = (byte)uVar31;
                if (bVar26 == 0) goto LAB_01d9ae4a;
                iVar2 = *(int *)(args.hit + 4);
                iVar22 = *(int *)(args.hit + 8);
                iVar23 = *(int *)(args.hit + 0xc);
                bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar11 = SUB81(uVar31 >> 3,0);
                *(uint *)(args.ray + 0xc0) =
                     (uint)(bVar26 & 1) * *(int *)args.hit |
                     (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xc0);
                *(uint *)(args.ray + 0xc4) =
                     (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(args.ray + 0xc4);
                *(uint *)(args.ray + 200) =
                     (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(args.ray + 200);
                *(uint *)(args.ray + 0xcc) =
                     (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xcc);
                iVar2 = *(int *)(args.hit + 0x14);
                iVar22 = *(int *)(args.hit + 0x18);
                iVar23 = *(int *)(args.hit + 0x1c);
                bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar11 = SUB81(uVar31 >> 3,0);
                *(uint *)(args.ray + 0xd0) =
                     (uint)(bVar26 & 1) * *(int *)(args.hit + 0x10) |
                     (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xd0);
                *(uint *)(args.ray + 0xd4) =
                     (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(args.ray + 0xd4);
                *(uint *)(args.ray + 0xd8) =
                     (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(args.ray + 0xd8);
                *(uint *)(args.ray + 0xdc) =
                     (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xdc);
                iVar2 = *(int *)(args.hit + 0x24);
                iVar22 = *(int *)(args.hit + 0x28);
                iVar23 = *(int *)(args.hit + 0x2c);
                bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar11 = SUB81(uVar31 >> 3,0);
                *(uint *)(args.ray + 0xe0) =
                     (uint)(bVar26 & 1) * *(int *)(args.hit + 0x20) |
                     (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xe0);
                *(uint *)(args.ray + 0xe4) =
                     (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(args.ray + 0xe4);
                *(uint *)(args.ray + 0xe8) =
                     (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(args.ray + 0xe8);
                *(uint *)(args.ray + 0xec) =
                     (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xec);
                iVar2 = *(int *)(args.hit + 0x34);
                iVar22 = *(int *)(args.hit + 0x38);
                iVar23 = *(int *)(args.hit + 0x3c);
                bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar11 = SUB81(uVar31 >> 3,0);
                *(uint *)(args.ray + 0xf0) =
                     (uint)(bVar26 & 1) * *(int *)(args.hit + 0x30) |
                     (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xf0);
                *(uint *)(args.ray + 0xf4) =
                     (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(args.ray + 0xf4);
                *(uint *)(args.ray + 0xf8) =
                     (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(args.ray + 0xf8);
                *(uint *)(args.ray + 0xfc) =
                     (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xfc);
                auVar60 = *(undefined1 (*) [16])(args.ray + 0x100);
                auVar54._0_4_ =
                     (uint)(bVar26 & 1) * *(int *)(args.hit + 0x40) |
                     (uint)!(bool)(bVar26 & 1) * auVar60._0_4_;
                bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar54._4_4_ =
                     (uint)bVar39 * *(int *)(args.hit + 0x44) | (uint)!bVar39 * auVar60._4_4_;
                bVar39 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar54._8_4_ =
                     (uint)bVar39 * *(int *)(args.hit + 0x48) | (uint)!bVar39 * auVar60._8_4_;
                bVar39 = SUB81(uVar31 >> 3,0);
                auVar54._12_4_ =
                     (uint)bVar39 * *(int *)(args.hit + 0x4c) | (uint)!bVar39 * auVar60._12_4_;
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar54;
                auVar60 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar60;
                auVar60 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar60;
                auVar60 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar60;
                auVar60 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar60;
                auVar101 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              uVar78 = auVar101._0_4_;
              auVar72._4_4_ = uVar78;
              auVar72._0_4_ = uVar78;
              auVar72._8_4_ = uVar78;
              auVar72._12_4_ = uVar78;
              uVar19 = vcmpps_avx512vl(auVar73._0_16_,auVar72,2);
              bVar27 = ~(byte)(1 << (uVar21 & 0x1f)) & bVar27 & (byte)uVar19;
            }
            if (bVar27 == 0) break;
            auVar71._8_4_ = 0x7f800000;
            auVar71._0_8_ = 0x7f8000007f800000;
            auVar71._12_4_ = 0x7f800000;
            auVar60 = vblendmps_avx512vl(auVar71,auVar73._0_16_);
            auVar62._0_4_ =
                 (uint)(bVar27 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar27 & 1) * 0x7f800000;
            bVar39 = (bool)(bVar27 >> 1 & 1);
            auVar62._4_4_ = (uint)bVar39 * auVar60._4_4_ | (uint)!bVar39 * 0x7f800000;
            bVar39 = (bool)(bVar27 >> 2 & 1);
            auVar62._8_4_ = (uint)bVar39 * auVar60._8_4_ | (uint)!bVar39 * 0x7f800000;
            auVar62._12_4_ =
                 (uint)(bVar27 >> 3) * auVar60._12_4_ | (uint)!(bool)(bVar27 >> 3) * 0x7f800000;
            auVar60 = vshufps_avx(auVar62,auVar62,0xb1);
            auVar60 = vminps_avx(auVar60,auVar62);
            auVar61 = vshufpd_avx(auVar60,auVar60,1);
            auVar60 = vminps_avx(auVar61,auVar60);
            uVar19 = vcmpps_avx512vl(auVar62,auVar60,0);
            bVar26 = (byte)uVar19 & bVar27;
          } while( true );
        }
      }
    }
    auVar101 = ZEXT3264(local_23f8);
    uVar31 = local_2688;
    uVar32 = local_2690;
    fVar79 = local_2398;
    fVar81 = fStack_2394;
    fVar82 = fStack_2390;
    fVar83 = fStack_238c;
    fVar84 = fStack_2388;
    fVar85 = fStack_2384;
    fVar86 = fStack_2380;
    fVar87 = local_23b8;
    fVar88 = fStack_23b4;
    fVar89 = fStack_23b0;
    fVar90 = fStack_23ac;
    fVar91 = fStack_23a8;
    fVar92 = fStack_23a4;
    fVar93 = fStack_23a0;
    fVar94 = local_23d8;
    fVar95 = fStack_23d4;
    fVar96 = fStack_23d0;
    fVar97 = fStack_23cc;
    fVar98 = fStack_23c8;
    fVar99 = fStack_23c4;
    fVar100 = fStack_23c0;
  }
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar73 = ZEXT3264(CONCAT428(uVar78,CONCAT424(uVar78,CONCAT420(uVar78,CONCAT416(uVar78,CONCAT412(
                                                  uVar78,CONCAT48(uVar78,CONCAT44(uVar78,uVar78)))))
                                               )));
  auVar63 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar102 = ZEXT3264(auVar63);
  auVar103 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  goto LAB_01d9a1dc;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }